

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O2

int Boots_on(void)

{
  boolean bVar1;
  uint uVar2;
  char *pcVar3;
  char *line;
  
  if (uarmf == (obj *)0x0) {
    return 0;
  }
  uVar2 = u.uprops[objects[uarmf->otyp].oc_oprop].extrinsic;
  Oprops_on(uarmf,0x20);
  switch(uarmf->otyp) {
  case 0x93:
  case 0x94:
  case 0x95:
  case 0x9a:
    goto switchD_001822b7_caseD_93;
  case 0x96:
    if ((uVar2 & 0xffffffdf) == 0) {
      if ((u.uprops[0x1a].intrinsic & 0xffffff) == 0) {
        discover_object(0x96,'\x01','\x01');
        pcVar3 = " a bit more";
        if (u.uprops[0x1a].intrinsic == 0) {
          pcVar3 = "";
        }
        line = "You feel yourself speed up%s.";
        goto LAB_00182403;
      }
      break;
    }
    goto switchD_001822b7_caseD_93;
  case 0x97:
    if ((((u._1052_1_ & 2) != 0) || (bVar1 = is_lava(level,(int)u.ux,(int)u.uy), bVar1 != '\0')) ||
       (bVar1 = is_swamp(level,(int)u.ux,(int)u.uy), bVar1 != '\0')) {
      spoteffects('\x01');
    }
    break;
  case 0x98:
    discover_object(0x98,'\x01','\x01');
    pcVar3 = body_part(9);
    pcVar3 = makeplural(pcVar3);
    line = "Your %s feel longer.";
LAB_00182403:
    pline(line,pcVar3);
    break;
  case 0x99:
    if ((((uVar2 & 0xffffffdf) == 0) && (u.uprops[0x13].intrinsic == 0)) &&
       (u.uprops[0x13].blocked == 0)) {
      discover_object(0x99,'\x01','\x01');
      pline("You walk very quietly.");
    }
    break;
  case 0x9b:
    if (((uVar2 & 0xffffffdf) == 0) && (u.uprops[0x25].intrinsic < 0x1000000)) {
      uVar2 = rnd(0x14);
      incr_itimeout(&u.uprops[0x25].intrinsic,(ulong)uVar2);
    }
    break;
  case 0x9c:
    if ((uVar2 & 0xffffffdf) != 0 || u.uprops[0x12].intrinsic != 0) break;
    discover_object(0x9c,'\x01','\x01');
    float_up();
    spoteffects('\0');
    if (uarmf == (obj *)0x0) {
      return 0;
    }
    goto switchD_001822b7_caseD_93;
  default:
    warning("Unknown type of %s (%d)","boots",(ulong)(uint)(int)uarmf->otyp);
  }
  if (uarmf != (obj *)0x0) {
switchD_001822b7_caseD_93:
    bVar1 = is_racial_armor(uarmf,&youmonst);
    if (bVar1 == '\0') {
      u.uconduct.unracearmor = u.uconduct.unracearmor + 1;
    }
  }
  if (1 < moves) {
    discover_cursed_equip(uarmf);
  }
  return 0;
}

Assistant:

static int Boots_on(void)
{
    long oldprop;

    if (!uarmf) return 0;

    oldprop = u.uprops[objects[uarmf->otyp].oc_oprop].extrinsic & ~WORN_BOOTS;

    Oprops_on(uarmf, WORN_BOOTS);

    switch(uarmf->otyp) {
	case LOW_BOOTS:
	case IRON_SHOES:
	case HIGH_BOOTS:
	case KICKING_BOOTS:
		break;
	case JUMPING_BOOTS:
        	/* jumping is obvious no matter what the situation */
        	makeknown(uarmf->otyp);
                pline("Your %s feel longer.", makeplural(body_part(LEG)));
                break;
	case WATER_WALKING_BOOTS:
		if (u.uinwater ||
		    is_lava(level, u.ux,u.uy) || is_swamp(level, u.ux,u.uy))
			spoteffects(TRUE);
		break;
	case SPEED_BOOTS:
		/* Speed boots are still better than intrinsic speed, */
		/* though not better than potion speed */
		if (!oldprop && !(HFast & TIMEOUT)) {
			makeknown(uarmf->otyp);
			pline("You feel yourself speed up%s.",
				(oldprop || HFast) ? " a bit more" : "");
		}
		break;
	case ELVEN_BOOTS:
		if (!oldprop && !HStealth && !BStealth) {
			makeknown(uarmf->otyp);
			pline("You walk very quietly.");
		}
		break;
	case FUMBLE_BOOTS:
		if (!oldprop && !(HFumbling & ~TIMEOUT))
			incr_itimeout(&HFumbling, rnd(20));
		break;
	case LEVITATION_BOOTS:
		if (!oldprop && !HLevitation) {
			makeknown(uarmf->otyp);
			float_up();
			spoteffects(FALSE); /* can unset uarmf */
			if (!uarmf) return 0;
		}
		break;
	default: warning(unknown_type, c_boots, uarmf->otyp);
    }

    if (uarmf && !is_racial_armor(uarmf, &youmonst))
	u.uconduct.unracearmor++;

    /* suppress message if called on first game turn via set_wear() */
    if (moves > 1)
	discover_cursed_equip(uarmf);

    return 0;
}